

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void PrepareListLine(char *buffer,aint hexadd)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  reference pvVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar7 = reglenwidth;
  pvVar4 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at
                     (&sourcePosStack,(long)IncludeLevel);
  uVar1 = pvVar4->line;
  uVar6 = (ulong)uVar1 % 10000;
  if ((int)uVar7 < 5) {
    uVar8 = 0x20;
  }
  else {
    uVar8 = 0x4e;
    if (uVar1 / 10000 < 0x4e) {
      uVar8 = uVar1 / 10000;
    }
    uVar8 = uVar8 + 0x30;
    uVar3 = (uint)uVar6 + 10000;
    if (uVar1 < 10000) {
      uVar3 = (uint)uVar6;
    }
    uVar7 = 5;
    uVar6 = (ulong)uVar3;
  }
  builtin_strncpy(buffer,"                        ",0x18);
  if (listmacro != 0) {
    buffer[0x17] = '>';
  }
  if (DAT_0018a510 == 2) {
    buffer[0x17] = '{';
  }
  snprintf(buffer,0x800,"%*u",(ulong)uVar7,uVar6);
  buffer[(int)uVar7] = ' ';
  iVar5 = 6 - uVar7;
  if (IncludeLevel < (int)(6 - uVar7)) {
    iVar5 = IncludeLevel;
  }
  memcpy(buffer + (int)uVar7,"++++++",(long)iVar5);
  snprintf(buffer + 6,0x800,"%04X",(ulong)(uint)hexadd & 0xffff);
  buffer[10] = ' ';
  if (0x30 < uVar8) {
    *buffer = (char)uVar8;
  }
  if (*substitutedLine == '\0') {
    substitutedLine = line;
  }
  pcVar2 = substitutedLine;
  strcpy(buffer + 0x18,substitutedLine);
  if (eolComment != (char *)0x0 && pcVar2 != line) {
    strncat(buffer,eolComment,0x1000);
    return;
  }
  return;
}

Assistant:

void PrepareListLine(char* buffer, aint hexadd)
{
	////////////////////////////////////////////////////
	// Line numbers to 1 to 99999 are supported only  //
	// For more lines, then first char is incremented //
	////////////////////////////////////////////////////

	int digit = ' ';
	int linewidth = reglenwidth;
	uint32_t currentLine = sourcePosStack.at(IncludeLevel).line;
	aint linenumber = currentLine % 10000;
	if (5 <= linewidth) {		// five-digit number, calculate the leading "digit"
		linewidth = 5;
		digit = currentLine / 10000 + '0';
		if (digit > '~') digit = '~';
		if (currentLine >= 10000) linenumber += 10000;
	}
	memset(buffer, ' ', 24);
	if (listmacro) buffer[23] = '>';
	if (Options::LST_T_MC_ONLY == Options::syx.ListingType) buffer[23] = '{';
	SPRINTF2(buffer, LINEMAX, "%*u", linewidth, linenumber); buffer[linewidth] = ' ';
	memcpy(buffer + linewidth, "++++++", IncludeLevel > 6 - linewidth ? 6 - linewidth : IncludeLevel);
	SPRINTF1(buffer + 6, LINEMAX, "%04X", hexadd & 0xFFFF); buffer[10] = ' ';
	if (digit > '0') *buffer = digit & 0xFF;
	// if substitutedLine is completely empty, list rather source line any way
	if (!*substitutedLine) substitutedLine = line;
	STRCPY(buffer + 24, LINEMAX2-24, substitutedLine);
	// add EOL comment if substituted was used and EOL comment is available
	if (substitutedLine != line && eolComment) STRCAT(buffer, LINEMAX2, eolComment);
}